

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

char * BrotliDecoderErrorString(BrotliDecoderErrorCode c)

{
  char *pcStack_10;
  BrotliDecoderErrorCode c_local;
  
  switch(c) {
  case BROTLI_DECODER_NO_ERROR:
    pcStack_10 = "NO_ERROR";
    break;
  case BROTLI_DECODER_SUCCESS:
    pcStack_10 = "SUCCESS";
    break;
  case BROTLI_DECODER_NEEDS_MORE_INPUT:
    pcStack_10 = "NEEDS_MORE_INPUT";
    break;
  case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
    pcStack_10 = "NEEDS_MORE_OUTPUT";
    break;
  case BROTLI_DECODER_ERROR_UNREACHABLE:
    pcStack_10 = "UNREACHABLE";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_BLOCK_TYPE_TREES:
    pcStack_10 = "BLOCK_TYPE_TREES";
    break;
  default:
    pcStack_10 = "INVALID";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_2:
    pcStack_10 = "RING_BUFFER_2";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1:
    pcStack_10 = "RING_BUFFER_1";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP:
    pcStack_10 = "CONTEXT_MAP";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_TREE_GROUPS:
    pcStack_10 = "TREE_GROUPS";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MODES:
    pcStack_10 = "CONTEXT_MODES";
    break;
  case BROTLI_DECODER_ERROR_INVALID_ARGUMENTS:
    pcStack_10 = "INVALID_ARGUMENTS";
    break;
  case BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET:
    pcStack_10 = "DICTIONARY_NOT_SET";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_DISTANCE:
    pcStack_10 = "DISTANCE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_PADDING_2:
    pcStack_10 = "PADDING_2";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_PADDING_1:
    pcStack_10 = "PADDING_1";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_WINDOW_BITS:
    pcStack_10 = "WINDOW_BITS";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_DICTIONARY:
    pcStack_10 = "DICTIONARY";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_TRANSFORM:
    pcStack_10 = "TRANSFORM";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_2:
    pcStack_10 = "BLOCK_LENGTH_2";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1:
    pcStack_10 = "BLOCK_LENGTH_1";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT:
    pcStack_10 = "CONTEXT_MAP_REPEAT";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE:
    pcStack_10 = "HUFFMAN_SPACE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_CL_SPACE:
    pcStack_10 = "CL_SPACE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME:
    pcStack_10 = "SIMPLE_HUFFMAN_SAME";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET:
    pcStack_10 = "SIMPLE_HUFFMAN_ALPHABET";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE:
    pcStack_10 = "EXUBERANT_META_NIBBLE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_RESERVED:
    pcStack_10 = "RESERVED";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE:
    pcStack_10 = "EXUBERANT_NIBBLE";
  }
  return pcStack_10;
}

Assistant:

const char* BrotliDecoderErrorString(BrotliDecoderErrorCode c) {
  switch (c) {
#define BROTLI_ERROR_CODE_CASE_(PREFIX, NAME, CODE) \
    case BROTLI_DECODER ## PREFIX ## NAME: return #NAME;
#define BROTLI_NOTHING_
    BROTLI_DECODER_ERROR_CODES_LIST(BROTLI_ERROR_CODE_CASE_, BROTLI_NOTHING_)
#undef BROTLI_ERROR_CODE_CASE_
#undef BROTLI_NOTHING_
    default: return "INVALID";
  }
}